

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_PtrDumpVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  void *pvVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  if (0 < vDes->nSize) {
    pvVar1 = *vDes->pArray;
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"// Design \"%s\" written via Ptr in ABC on %s\n\n",pvVar1,pcVar2);
    if (1 < vDes->nSize) {
      lVar3 = 1;
      do {
        Bac_PtrDumpModuleVerilog((FILE *)__stream,(Vec_Ptr_t *)vDes->pArray[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < vDes->nSize);
    }
    fclose(__stream);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrDumpVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    FILE * pFile;
    Vec_Ptr_t * vNtk; int i;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written via Ptr in ABC on %s\n\n", (char *)Vec_PtrEntry(vDes, 0), Extra_TimeStamp() );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Bac_PtrDumpModuleVerilog( pFile, vNtk );
    fclose( pFile );
}